

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint *id)

{
  uint *puVar1;
  Question *pQVar2;
  Question *pQVar3;
  uint uVar4;
  long lVar5;
  size_t newSize;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  puVar1 = (this->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 == (this->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pQVar3 = (this->slots).builder.ptr;
    pQVar2 = (this->slots).builder.pos;
    lVar5 = (long)pQVar2 - (long)pQVar3 >> 3;
    uVar4 = (int)lVar5 * -0x33333333;
    *id = uVar4;
    _kjCondition.value = (int)uVar4 >= 0;
    if ((int)uVar4 < 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xfb,FAILED,"!isHigh(id)","_kjCondition,\"2^31 concurrent questions?!!?!\"",
                 &_kjCondition,(char (*) [31])"2^31 concurrent questions?!!?!");
      kj::_::Debug::Fault::fatal(&f);
    }
    if (pQVar2 == (this->slots).builder.endPtr) {
      newSize = 4;
      if (pQVar2 != pQVar3) {
        newSize = lVar5 * -0x6666666666666666;
      }
      kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::setCapacity
                (&this->slots,newSize);
      pQVar2 = (this->slots).builder.pos;
    }
    (pQVar2->paramExports).disposer = (ArrayDisposer *)0x0;
    (pQVar2->selfRef).ptr = (QuestionRef *)0x0;
    (pQVar2->paramExports).ptr = (uint *)0x0;
    (pQVar2->paramExports).size_ = 0;
    pQVar2->isAwaitingReturn = false;
    pQVar2->isTailCall = false;
    pQVar2->skipFinish = false;
    *(undefined5 *)&pQVar2->field_0x23 = 0;
    pQVar3 = (this->slots).builder.pos;
    (this->slots).builder.pos = pQVar3 + 1;
  }
  else {
    *id = *puVar1;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::pop(&this->freeIds);
    pQVar3 = (this->slots).builder.ptr + *id;
  }
  return pQVar3;
}

Assistant:

T& next(Id& id) {
    if (freeIds.empty()) {
      id = slots.size();
      KJ_ASSERT(!isHigh(id), "2^31 concurrent questions?!!?!");
      return slots.add();
    } else {
      id = freeIds.top();
      freeIds.pop();
      return slots[id];
    }
  }